

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

TARGET_LEVEL_FAIL_ID
check_level_constraints
          (AV1LevelInfo *level_info,AV1_LEVEL level,int tier,int is_still_picture,
          BITSTREAM_PROFILE profile,int check_bitrate)

{
  int iVar1;
  int in_ECX;
  int iVar2;
  int in_EDX;
  byte in_SIL;
  long in_RDI;
  BITSTREAM_PROFILE in_R8B;
  int in_R9D;
  int val;
  int scalability_mode_idc;
  int temporal_parallel_denom;
  int temporal_parallel_num;
  double avg_bitrate;
  double bitrate_limit;
  double min_cr;
  int max_tile_size;
  TARGET_LEVEL_FAIL_ID fail_id;
  AV1LevelStats *level_stats;
  AV1LevelSpec *target_level_spec;
  AV1LevelSpec *level_spec;
  DECODER_MODEL_STATUS decoder_model_status;
  DECODER_MODEL *decoder_model;
  int local_78;
  int local_74;
  double local_70;
  double local_68;
  double local_60;
  undefined4 local_58;
  TARGET_LEVEL_FAIL_ID local_54;
  long local_50;
  AV1LevelSpec *local_48;
  long local_40;
  char local_31;
  char *local_30;
  int local_24;
  BITSTREAM_PROFILE local_1d;
  int local_18;
  
  local_30 = (char *)(in_RDI + 0x3090 + (ulong)in_SIL * 0x7b0);
  local_31 = *local_30;
  if ((local_31 != '\0') && (local_31 != '\a')) {
    return DECODER_MODEL_FAIL;
  }
  local_40 = in_RDI + 0x38;
  local_48 = av1_level_defs + in_SIL;
  local_54 = TARGET_LEVEL_OK;
  if (av1_level_defs[in_SIL].max_picture_size < *(int *)(in_RDI + 0x3c)) {
    local_54 = LUMA_PIC_SIZE_TOO_LARGE;
  }
  else if (av1_level_defs[in_SIL].max_h_size < *(int *)(in_RDI + 0x40)) {
    local_54 = LUMA_PIC_H_SIZE_TOO_LARGE;
  }
  else if (av1_level_defs[in_SIL].max_v_size < *(int *)(in_RDI + 0x44)) {
    local_54 = LUMA_PIC_V_SIZE_TOO_LARGE;
  }
  else if (av1_level_defs[in_SIL].max_tile_cols < *(int *)(in_RDI + 0x54)) {
    local_54 = TOO_MANY_TILE_COLUMNS;
  }
  else if (av1_level_defs[in_SIL].max_tiles < *(int *)(in_RDI + 0x50)) {
    local_54 = TOO_MANY_TILES;
  }
  else if (av1_level_defs[in_SIL].max_header_rate < *(int *)(in_RDI + 0x48)) {
    local_54 = FRAME_HEADER_RATE_TOO_HIGH;
  }
  else if (*(double *)(local_30 + 0x7a0) <= (double)av1_level_defs[in_SIL].max_display_rate) {
    if (av1_level_defs[in_SIL].max_decode_rate < *(long *)(in_RDI + 0x60)) {
      local_54 = DECODE_RATE_TOO_HIGH;
    }
    else {
      iVar1 = *(int *)(in_RDI + 0x4c);
      iVar2 = av1_level_defs[in_SIL].max_tiles * 0x78;
      if (iVar1 == iVar2 ||
          SBORROW4(iVar1,iVar2) != iVar1 + av1_level_defs[in_SIL].max_tiles * -0x78 < 0) {
        local_58 = 0x900000;
        if (*(int *)(in_RDI + 4) < 0x900001) {
          if (*(int *)(in_RDI + 8) < 0x1001) {
            if (*(int *)(in_RDI + 0xc) < 8) {
              local_54 = CROPPED_TILE_WIDTH_TOO_SMALL;
            }
            else if (*(int *)(in_RDI + 0x10) < 8) {
              local_54 = CROPPED_TILE_HEIGHT_TOO_SMALL;
            }
            else if (*(int *)(in_RDI + 0x18) < 0x10) {
              local_54 = LUMA_PIC_H_SIZE_TOO_SMALL;
            }
            else if (*(int *)(in_RDI + 0x1c) < 0x10) {
              local_54 = LUMA_PIC_V_SIZE_TOO_SMALL;
            }
            else if (*(int *)(in_RDI + 0x14) == 0) {
              local_54 = TILE_WIDTH_INVALID;
            }
            else {
              local_50 = in_RDI;
              local_24 = in_R9D;
              local_1d = in_R8B;
              local_18 = in_EDX;
              local_60 = get_min_cr(local_48,in_EDX,in_ECX,*(int64_t *)(in_RDI + 0x60));
              if (local_60 <= *(double *)(local_50 + 0x30)) {
                if (local_24 != 0) {
                  local_68 = get_max_bitrate(local_48,local_18,local_1d);
                  local_70 = (*(double *)(local_50 + 0x20) * 8.0) / *(double *)(local_50 + 0x28);
                  if (local_68 < local_70) {
                    return BITRATE_TOO_HIGH;
                  }
                }
                if ((0xd < local_48->level) &&
                   (get_temporal_parallel_params(-1,&local_74,&local_78),
                   0x23100000 <
                   (*(int *)(local_50 + 4) * *(int *)(local_40 + 0x10) * local_78) / local_74)) {
                  local_54 = TILE_SIZE_HEADER_RATE_TOO_HIGH;
                }
              }
              else {
                local_54 = CR_TOO_SMALL;
              }
            }
          }
          else {
            local_54 = SUPERRES_TILE_WIDTH_TOO_LARGE;
          }
        }
        else {
          local_54 = TILE_TOO_LARGE;
        }
      }
      else {
        local_54 = TILE_RATE_TOO_HIGH;
      }
    }
  }
  else {
    local_54 = DISPLAY_RATE_TOO_HIGH;
  }
  return local_54;
}

Assistant:

static TARGET_LEVEL_FAIL_ID check_level_constraints(
    const AV1LevelInfo *const level_info, AV1_LEVEL level, int tier,
    int is_still_picture, BITSTREAM_PROFILE profile, int check_bitrate) {
  const DECODER_MODEL *const decoder_model = &level_info->decoder_models[level];
  const DECODER_MODEL_STATUS decoder_model_status = decoder_model->status;
  if (decoder_model_status != DECODER_MODEL_OK &&
      decoder_model_status != DECODER_MODEL_DISABLED) {
    return DECODER_MODEL_FAIL;
  }

  const AV1LevelSpec *const level_spec = &level_info->level_spec;
  const AV1LevelSpec *const target_level_spec = &av1_level_defs[level];
  const AV1LevelStats *const level_stats = &level_info->level_stats;
  TARGET_LEVEL_FAIL_ID fail_id = TARGET_LEVEL_OK;
  do {
    if (level_spec->max_picture_size > target_level_spec->max_picture_size) {
      fail_id = LUMA_PIC_SIZE_TOO_LARGE;
      break;
    }

    if (level_spec->max_h_size > target_level_spec->max_h_size) {
      fail_id = LUMA_PIC_H_SIZE_TOO_LARGE;
      break;
    }

    if (level_spec->max_v_size > target_level_spec->max_v_size) {
      fail_id = LUMA_PIC_V_SIZE_TOO_LARGE;
      break;
    }

    if (level_spec->max_tile_cols > target_level_spec->max_tile_cols) {
      fail_id = TOO_MANY_TILE_COLUMNS;
      break;
    }

    if (level_spec->max_tiles > target_level_spec->max_tiles) {
      fail_id = TOO_MANY_TILES;
      break;
    }

    if (level_spec->max_header_rate > target_level_spec->max_header_rate) {
      fail_id = FRAME_HEADER_RATE_TOO_HIGH;
      break;
    }

    if (decoder_model->max_display_rate >
        (double)target_level_spec->max_display_rate) {
      fail_id = DISPLAY_RATE_TOO_HIGH;
      break;
    }

    // TODO(huisu): we are not using max decode rate calculated by the decoder
    // model because the model in resource availability mode always returns
    // MaxDecodeRate(as in the level definitions) as the max decode rate.
    if (level_spec->max_decode_rate > target_level_spec->max_decode_rate) {
      fail_id = DECODE_RATE_TOO_HIGH;
      break;
    }

    if (level_spec->max_tile_rate > target_level_spec->max_tiles * 120) {
      fail_id = TILE_RATE_TOO_HIGH;
      break;
    }

#if CONFIG_CWG_C013
    const int max_tile_size = (level >= SEQ_LEVEL_7_0 && level <= SEQ_LEVEL_8_3)
                                  ? MAX_TILE_AREA_LEVEL_7_AND_ABOVE
                                  : MAX_TILE_AREA;
#else
    const int max_tile_size = MAX_TILE_AREA;
#endif
    if (level_stats->max_tile_size > max_tile_size) {
      fail_id = TILE_TOO_LARGE;
      break;
    }

    if (level_stats->max_superres_tile_width > MAX_TILE_WIDTH) {
      fail_id = SUPERRES_TILE_WIDTH_TOO_LARGE;
      break;
    }

    if (level_stats->min_cropped_tile_width < MIN_CROPPED_TILE_WIDTH) {
      fail_id = CROPPED_TILE_WIDTH_TOO_SMALL;
      break;
    }

    if (level_stats->min_cropped_tile_height < MIN_CROPPED_TILE_HEIGHT) {
      fail_id = CROPPED_TILE_HEIGHT_TOO_SMALL;
      break;
    }

    if (level_stats->min_frame_width < MIN_FRAME_WIDTH) {
      fail_id = LUMA_PIC_H_SIZE_TOO_SMALL;
      break;
    }

    if (level_stats->min_frame_height < MIN_FRAME_HEIGHT) {
      fail_id = LUMA_PIC_V_SIZE_TOO_SMALL;
      break;
    }

    if (!level_stats->tile_width_is_valid) {
      fail_id = TILE_WIDTH_INVALID;
      break;
    }

    const double min_cr = get_min_cr(target_level_spec, tier, is_still_picture,
                                     level_spec->max_decode_rate);
    if (level_stats->min_cr < min_cr) {
      fail_id = CR_TOO_SMALL;
      break;
    }

    if (check_bitrate) {
      // Check average bitrate instead of max_bitrate.
      const double bitrate_limit =
          get_max_bitrate(target_level_spec, tier, profile);
      const double avg_bitrate = level_stats->total_compressed_size * 8.0 /
                                 level_stats->total_time_encoded;
      if (avg_bitrate > bitrate_limit) {
        fail_id = BITRATE_TOO_HIGH;
        break;
      }
    }

    if (target_level_spec->level > SEQ_LEVEL_5_1) {
      int temporal_parallel_num;
      int temporal_parallel_denom;
      const int scalability_mode_idc = -1;
      get_temporal_parallel_params(scalability_mode_idc, &temporal_parallel_num,
                                   &temporal_parallel_denom);
      const int val = level_stats->max_tile_size * level_spec->max_header_rate *
                      temporal_parallel_denom / temporal_parallel_num;
      if (val > MAX_TILE_SIZE_HEADER_RATE_PRODUCT) {
        fail_id = TILE_SIZE_HEADER_RATE_TOO_HIGH;
        break;
      }
    }
  } while (0);

  return fail_id;
}